

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long lVar6;
  bool bVar7;
  uint *puVar8;
  slot_type *psVar9;
  ulong uVar10;
  size_t sVar11;
  byte bVar12;
  size_t sVar13;
  ctrl_t cVar14;
  ulong uVar15;
  FindInfo FVar16;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  undefined1 local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe14,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("!set->fits_in_soo(new_capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe15,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  sVar11 = common->capacity_;
  if (sVar11 == 0) {
    __assert_fail("!kEnabled || cap >= kCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb37,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  uVar1 = common->size_;
  if (1 < uVar1 && sVar11 == 1) {
    puVar8 = (uint *)soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                               *)common);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)*puVar8;
    bVar12 = (SUB161(auVar3 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB161(auVar3 * ZEXT816(0x9ddfea08eb382d69),0)) & 0x7f;
    local_40 = (byte)common->size_;
    local_48 = common->capacity_;
  }
  else {
    bVar12 = 0x80;
    local_40 = (byte)uVar1;
    local_48 = sVar11;
  }
  local_40 = local_40 & 1;
  local_3f = sVar11 == 1;
  local_58._0_4_ = *(undefined4 *)&common->heap_or_soo_;
  local_58._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
  local_58._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
  local_58._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
  common->capacity_ = new_capacity;
  local_3e = 1 < uVar1 && sVar11 == 1;
  bVar7 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,4ul,true,true,4ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar12,4,4);
  if (local_48 == 0) {
    __assert_fail("resize_helper.old_capacity() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe38,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<int>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<int>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<int>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<int>]"
                 );
  }
  if (sVar11 != 1 || 1 < uVar1) {
    psVar9 = slot_array((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<int>,_absl::lts_20240722::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                         *)common);
    if (!bVar7) {
      if (sVar11 == 1) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (ulong)(uint)local_58._0_4_;
        uVar15 = SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),8) ^
                 SUB168(auVar4 * ZEXT816(0x9ddfea08eb382d69),0);
        FVar16 = absl::lts_20240722::container_internal::find_first_non_full<void>(common,uVar15);
        uVar10 = FVar16.offset;
        uVar1 = common->capacity_;
        if (uVar1 <= uVar10) {
LAB_00231d9e:
          __assert_fail("i < c.capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x70c,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar14 = (ctrl_t)uVar15 & ~kEmpty;
        pcVar2 = (common->heap_or_soo_).heap.control;
        pcVar2[uVar10] = cVar14;
        pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar10 - 0xf & uVar1)] = cVar14;
        psVar9[uVar10] = local_58._0_4_;
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7c2,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          lVar6 = CONCAT44(local_58._12_4_,local_58._8_4_);
          sVar13 = 0;
          sVar11 = local_48;
          do {
            if (local_3f == '\x01') {
              __assert_fail("!was_soo_",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7be,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (-1 < *(char *)(CONCAT44(local_58._4_4_,local_58._0_4_) + sVar13)) {
              auVar5._8_8_ = 0;
              auVar5._0_8_ = (long)&hash_internal::MixingHashState::kSeed +
                             (ulong)*(uint *)(lVar6 + sVar13 * 4);
              uVar15 = SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                       SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0);
              FVar16 = absl::lts_20240722::container_internal::find_first_non_full<void>
                                 (common,uVar15);
              uVar10 = FVar16.offset;
              uVar1 = common->capacity_;
              if (uVar1 <= uVar10) goto LAB_00231d9e;
              cVar14 = (ctrl_t)uVar15 & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              pcVar2[uVar10] = cVar14;
              pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar10 - 0xf & uVar1)] = cVar14;
              psVar9[uVar10] = *(slot_type *)(lVar6 + sVar13 * 4);
              sVar11 = local_48;
            }
            sVar13 = sVar13 + 1;
          } while (sVar13 != sVar11);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<4ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,4);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }